

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O1

void __thiscall
expr_tree::expr_tree
          (expr_tree *this,expr_node *_root,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *_parameters,string *_variable,string *_name)

{
  pointer pcVar1;
  
  this->root_ = _root;
  tld::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  vector(&this->parameters_,_parameters);
  (this->variable_)._M_dataplus._M_p = (pointer)&(this->variable_).field_2;
  pcVar1 = (_variable->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->variable_,pcVar1,pcVar1 + _variable->_M_string_length);
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + _name->_M_string_length);
  this->errno_ = 0;
  return;
}

Assistant:

expr_tree::expr_tree(expr_node* _root, const tld::vector<std::string>& _parameters, const std::string& _variable, const std::string& _name) :
    root_(_root),
    parameters_(_parameters),
    variable_(_variable),
    name_(_name),
    errno_(T_OK)
{}